

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O2

clockid_t check_get_clockid(void)

{
  int iVar1;
  timer_t in_RAX;
  timer_t timerid;
  
  timerid = in_RAX;
  iVar1 = timer_create(1,(sigevent *)0x0,&timerid);
  if (iVar1 == 0) {
    timer_delete(timerid);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

clockid_t check_get_clockid()
{
    static clockid_t clockid = -1;

/*
 * Only check if we have librt available. Otherwise, the clockid
 * will be ignored anyway, as the clock_gettime() and
 * timer_create() functions will be re-implemented in libcompat.
 * Worse, if librt and alarm() are unavailable, this check
 * will result in an assert(0).
 */
#ifdef HAVE_LIBRT
    timer_t timerid;

    if(timer_create(CLOCK_MONOTONIC, NULL, &timerid) == 0)
    {
        timer_delete(timerid);
        clockid = CLOCK_MONOTONIC;
    }
    else
    {
        clockid = CLOCK_REALTIME;
    }
#else
    clockid = CLOCK_MONOTONIC;
#endif

    return clockid;
}